

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parsedoffset.cc
# Opt level: O0

string * make_objdesc_abi_cxx11_
                   (string *__return_storage_ptr__,qpdf_offset_t offset,QPDFObjectHandle *obj)

{
  byte bVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  QPDFObjectHandle *local_20;
  QPDFObjectHandle *obj_local;
  qpdf_offset_t offset_local;
  
  local_20 = obj;
  obj_local = (QPDFObjectHandle *)offset;
  offset_local = (qpdf_offset_t)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar3 = std::operator<<(local_198,"offset = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(longlong)obj_local);
  poVar3 = std::operator<<(poVar3," (0x");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(longlong)obj_local);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::dec);
  std::operator<<(poVar3,"), ");
  bVar1 = QPDFObjectHandle::isIndirect();
  if ((bVar1 & 1) == 0) {
    std::operator<<(local_198,"direct, ");
  }
  else {
    poVar3 = std::operator<<(local_198,"indirect ");
    iVar2 = QPDFObjectHandle::getObjectID();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,"/");
    iVar2 = QPDFObjectHandle::getGeneration();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::operator<<(poVar3,", ");
  }
  pcVar4 = (char *)QPDFObjectHandle::getTypeName();
  std::operator<<(local_198,pcVar4);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string
make_objdesc(qpdf_offset_t offset, QPDFObjectHandle obj)
{
    std::stringstream ss;
    ss << "offset = " << offset << " (0x" << std::hex << offset << std::dec << "), ";

    if (obj.isIndirect()) {
        ss << "indirect " << obj.getObjectID() << "/" << obj.getGeneration() << ", ";
    } else {
        ss << "direct, ";
    }

    ss << obj.getTypeName();

    return ss.str();
}